

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

int __thiscall
slang::SmallVectorBase<slang::ast::DistExpression::DistItem>::copy
          (SmallVectorBase<slang::ast::DistExpression::DistItem> *this,EVP_PKEY_CTX *dst,
          EVP_PKEY_CTX *src)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  pointer pDVar3;
  size_type sVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  DistItem *first;
  long lVar8;
  int local_18 [4];
  
  if (this->len != 0) {
    first = (DistItem *)BumpAllocator::allocate((BumpAllocator *)dst,this->len << 5,8);
    pDVar3 = this->data_;
    sVar4 = this->len;
    for (lVar8 = 0; sVar4 << 5 != lVar8; lVar8 = lVar8 + 0x20) {
      puVar1 = (undefined8 *)((long)&pDVar3->value + lVar8);
      puVar2 = (undefined8 *)((long)&first->value + lVar8);
      uVar5 = *puVar1;
      uVar6 = puVar1[1];
      uVar7 = puVar1[3];
      puVar2[2] = puVar1[2];
      puVar2[3] = uVar7;
      *puVar2 = uVar5;
      puVar2[1] = uVar6;
    }
    nonstd::span_lite::span<slang::ast::DistExpression::DistItem,18446744073709551615ul>::
    span<slang::ast::DistExpression::DistItem*>
              ((span<slang::ast::DistExpression::DistItem,18446744073709551615ul> *)local_18,first,
               this->len);
    return local_18[0];
  }
  return 0;
}

Assistant:

[[nodiscard]] span<T> copy(BumpAllocator& alloc) const {
        if (len == 0)
            return {};

        pointer dest = reinterpret_cast<pointer>(alloc.allocate(len * sizeof(T), alignof(T)));
        std::uninitialized_copy(begin(), end(), dest);

        return span<T>(dest, len);
    }